

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inference.hpp
# Opt level: O3

bool Shell::pushFirstPremiseToAnswerIfFromResolver(Inference *inf,Stack<Kernel::Clause_*> *answer)

{
  bool bVar1;
  Unit *this;
  Clause *cl;
  Clause **ppCVar2;
  Iterator it;
  anon_union_8_2_756040a0_for_Iterator_0 local_18;
  
  local_18.pointer = (void *)((ulong)(byte)inf->field_0x1 << 8);
  if (local_18.integer == 0x4500) {
    local_18 = (anon_union_8_2_756040a0_for_Iterator_0)Kernel::Inference::iterator(inf);
    this = Kernel::Inference::next(inf,(Iterator *)&local_18);
    cl = Kernel::Unit::asClause(this);
    bVar1 = isProperAnswerClause(cl);
    if (bVar1) {
      ppCVar2 = answer->_cursor;
      if (ppCVar2 == answer->_end) {
        Lib::Stack<Kernel::Clause_*>::expand(answer);
        ppCVar2 = answer->_cursor;
      }
      *ppCVar2 = cl;
      answer->_cursor = answer->_cursor + 1;
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
    return bVar1;
  }
  return false;
}

Assistant:

InferenceRule rule() const { return _rule; }